

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  char *pcVar3;
  FILE *__stream;
  char *type;
  FILE *fp;
  node *root;
  char *outfile;
  char **phone_list;
  int32 nphones;
  int32 *phoneids;
  int32 nquests;
  int32 *nquestphone;
  int32 **questarr;
  int32 continuous;
  int32 k;
  int32 j;
  int32 i;
  uint32 nquests_per_state;
  uint32 npermute;
  uint32 state;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_state;
  uint32 n_model;
  uint32 veclen;
  float32 **lvars;
  float32 ***vars;
  float32 **lmeans;
  float32 ***means;
  float32 ***lmixw;
  float32 ****mixw;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  lmixw = (float32 ***)0x0;
  mixw = (float32 ****)argv;
  argv_local._0_4_ = argc;
  parse_cmd_ln(argc,argv);
  pcVar2 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar2,"-type");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
            ,0x3fd,
            "-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n");
    exit(1);
  }
  iVar1 = strcmp(pcVar3,".cont.");
  if (iVar1 == 0) {
    questarr._0_4_ = 1;
  }
  else {
    iVar1 = strcmp(pcVar3,".semi.");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
              ,0x406,"Unknown type %s, either \".cont.\" or \".semi.\"\n",pcVar3);
      exit(1);
    }
    questarr._0_4_ = 0;
  }
  if ((int)questarr == -1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
            ,0x40a,"-type is not set correctly\n");
    exit(1);
  }
  pcVar2 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar2,"-questfn");
  pcVar2 = cmd_ln_get();
  cmd_ln_int_r(pcVar2,"-npermute");
  pcVar2 = cmd_ln_get();
  cmd_ln_int_r(pcVar2,"-qstperstt");
  __stream = fopen(pcVar3,"w");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
            ,0x413,"Unable to open %s for writing!\n",pcVar3);
    exit(1);
  }
  fprintf(__stream,"WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n");
  fclose(__stream);
  iVar1 = init((EVP_PKEY_CTX *)&lmixw);
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
            ,0x45b,"Stored questions in %s\n",pcVar3);
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
          ,0x421,"Initialization failed\n");
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    float32 ****mixw = NULL,***lmixw = NULL;
    float32 ***means = NULL, **lmeans = NULL;
    float32 ***vars = NULL, **lvars = NULL;
    uint32 veclen = 0;
    uint32 n_model = 0;
    uint32 n_state = 0;
    uint32 n_feat = 0;
    uint32 n_density = 0;
    uint32 state;
    uint32 npermute, nquests_per_state;
    int32 i, j, k, continuous, **questarr, *nquestphone, nquests=0;
    int32  *phoneids,nphones;
    char   **phone_list = NULL;
    const char   *outfile;
    node   *root;
    FILE   *fp;
    const char* type;

    parse_cmd_ln(argc, argv);

    type = cmd_ln_str("-type");
    
    if(type==NULL){
      E_FATAL("-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n");
    }

    continuous = -1;
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else if (strcmp(type,".semi.") == 0) 
        continuous = 0;
    else{
      E_FATAL("Unknown type %s, either \".cont.\" or \".semi.\"\n", type);
    }
      
    if(continuous ==-1){
      E_FATAL("-type is not set correctly\n");
    }

    outfile = cmd_ln_str("-questfn");
    npermute = cmd_ln_int32("-npermute");
    nquests_per_state = cmd_ln_int32("-qstperstt");

    /* Test and cleanup outfile */
    if ((fp = fopen(outfile,"w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",outfile);
    fprintf(fp,"WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n");
    fclose(fp);

    if (init(&mixw,
             &means,
             &vars,
             &veclen,
	     &n_model,
	     &n_state,
	     &n_feat,
             &n_density,
	     &phone_list,
	     continuous) != S3_SUCCESS) {
	E_FATAL("Initialization failed\n");
    }

    for (state = 0; state < n_state; state++){
        phoneids = (int32 *) ckd_calloc(n_model,sizeof(int32));
        root = (node *) ckd_calloc(1,sizeof(node));
        nphones = n_model;
        lmixw = (float32 ***)ckd_calloc_3d(n_model,n_feat,n_density,sizeof(float32));
        if (continuous) {
            lmeans = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            lvars = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                lmixw[i][0][0] = mixw[i][state][0][0];
                for (j=0;j<veclen;j++){
                    lmeans[i][j] = means[i][state][j];
                    lvars[i][j] = vars[i][state][j];
                }
            }
        }
        else {
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                for (j=0;j<n_feat;j++)
                    for (k=0;k<n_density;k++)
                        lmixw[i][j][k] = mixw[i][state][j][k];
            }
        }
        root = make_tree(lmeans,lvars,lmixw,phoneids,nphones,n_density,n_feat,veclen,npermute,0, continuous);
        if (continuous) {
            ckd_free_2d((void **)lmeans); ckd_free_2d((void **)lvars); 
        }
        ckd_free_3d((void ***)lmixw); ckd_free((void *)phoneids);

        questarr = (int32 **)ckd_calloc(n_state*n_model,sizeof(int32 *));
        nquestphone = (int32 *)ckd_calloc(n_state*n_model,sizeof(int32));

        prune_quests(root,nquests_per_state);
        nquests = get_quests(root,questarr,nquestphone,0,0);

        free_tree(root);

        fp = fopen(outfile,"a");
        for (i=0;i<nquests;i++){
            if (state < n_state/2) fprintf(fp,"QUESTION%d_%d_R ",state,i);
            else if (state == n_state/2) fprintf(fp,"QUESTION%d ",i);
            else fprintf(fp,"QUESTION%d_%d_L ",state,i);
            for (j=0;j<nquestphone[i];j++) 
                fprintf(fp," %s",phone_list[questarr[i][j]]);
            fprintf(fp,"\n");
        }
        fclose(fp);
        E_INFO("Done building questions using state %d\n",state);
        E_INFO(" %d questions from state %d\n",nquests,state);
        for(i=0;i<nquests;i++) ckd_free((void *)questarr[i]);
        ckd_free((void **)questarr);
        ckd_free((void *)nquestphone);
    }
    E_INFO ("Stored questions in %s\n",outfile);
    return 0;
}